

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_refresh(OpenJTalk *oj)

{
  if (oj != (OpenJTalk *)0x0) {
    openjtalk_stop(oj);
    if ((g_psd != (SpeakData *)0x0) && (g_psd->data != (short *)0x0)) {
      free(g_psd->data);
      g_psd->data = (short *)0x0;
    }
    Open_JTalk_refresh(oj->open_jtalk);
    JTalkData_initialize(oj);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_refresh(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);

	if (g_psd != NULL && g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}

	Open_JTalk_refresh(oj->open_jtalk);

	if (!JTalkData_initialize(oj))
	{
		return;
	}
}